

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

void __thiscall UnionType::UnionType(UnionType *this,string *name)

{
  pointer pcVar1;
  
  (this->super_AggregateType).super_Type.kind = TK_UnionType;
  (this->super_AggregateType).super_Type.isConst = false;
  (this->super_AggregateType).super_Type._vptr_Type = (_func_int **)&PTR__AggregateType_0017d9a0;
  (this->super_AggregateType).name._M_dataplus._M_p =
       (pointer)&(this->super_AggregateType).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_AggregateType).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_AggregateType).items.
  super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_AggregateType).items.
  super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_AggregateType).items.
  super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_AggregateType).super_Type._vptr_Type = (_func_int **)&PTR__AggregateType_0017d850;
  return;
}

Assistant:

UnionType::UnionType(const std::string& name) : AggregateType(TK_UnionType, name) {}